

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Stk.cpp
# Opt level: O3

void stk::Stk::swap64(uchar *ptr)

{
  ulong uVar1;
  short sVar2;
  short sVar3;
  short sVar4;
  short sVar5;
  short sVar6;
  short sVar7;
  short sVar8;
  short sVar9;
  undefined1 auVar10 [15];
  undefined1 auVar11 [15];
  undefined1 auVar12 [15];
  undefined1 auVar13 [15];
  undefined1 auVar14 [15];
  undefined1 auVar15 [15];
  undefined1 auVar16 [15];
  undefined1 auVar17 [15];
  undefined1 auVar18 [11];
  undefined1 auVar19 [15];
  undefined1 auVar20 [15];
  undefined1 auVar21 [16];
  
  uVar1 = *(ulong *)ptr;
  auVar10._8_6_ = 0;
  auVar10._0_8_ = uVar1;
  auVar10[0xe] = (char)(uVar1 >> 0x38);
  auVar11._8_4_ = 0;
  auVar11._0_8_ = uVar1;
  auVar11[0xc] = (char)(uVar1 >> 0x30);
  auVar11._13_2_ = auVar10._13_2_;
  auVar12._8_4_ = 0;
  auVar12._0_8_ = uVar1;
  auVar12._12_3_ = auVar11._12_3_;
  auVar13._8_2_ = 0;
  auVar13._0_8_ = uVar1;
  auVar13[10] = (char)(uVar1 >> 0x28);
  auVar13._11_4_ = auVar12._11_4_;
  auVar14._8_2_ = 0;
  auVar14._0_8_ = uVar1;
  auVar14._10_5_ = auVar13._10_5_;
  auVar15[8] = (char)(uVar1 >> 0x20);
  auVar15._0_8_ = uVar1;
  auVar15._9_6_ = auVar14._9_6_;
  auVar21[7] = 0;
  auVar21._0_7_ = auVar15._8_7_;
  auVar17._7_8_ = 0;
  auVar17._0_7_ = auVar15._8_7_;
  auVar19._1_8_ = SUB158(auVar17 << 0x40,7);
  auVar19[0] = (char)(uVar1 >> 0x18);
  auVar19._9_6_ = 0;
  auVar18._1_10_ = SUB1510(auVar19 << 0x30,5);
  auVar18[0] = (char)(uVar1 >> 0x10);
  auVar20._11_4_ = 0;
  auVar20._0_11_ = auVar18;
  auVar16._3_12_ = SUB1512(auVar20 << 0x20,3);
  auVar16[2] = (char)(uVar1 >> 8);
  auVar16[1] = 0;
  auVar16[0] = (byte)uVar1;
  auVar21._8_4_ = auVar16._0_4_;
  auVar21._12_4_ = auVar18._0_4_;
  auVar21 = pshuflw(auVar21,auVar21,0x1b);
  auVar21 = pshufhw(auVar21,auVar21,0x1b);
  sVar2 = auVar21._0_2_;
  sVar3 = auVar21._2_2_;
  sVar4 = auVar21._4_2_;
  sVar5 = auVar21._6_2_;
  sVar6 = auVar21._8_2_;
  sVar7 = auVar21._10_2_;
  sVar8 = auVar21._12_2_;
  sVar9 = auVar21._14_2_;
  *(ulong *)ptr =
       CONCAT17((0 < sVar9) * (sVar9 < 0x100) * auVar21[0xe] - (0xff < sVar9),
                CONCAT16((0 < sVar8) * (sVar8 < 0x100) * auVar21[0xc] - (0xff < sVar8),
                         CONCAT15((0 < sVar7) * (sVar7 < 0x100) * auVar21[10] - (0xff < sVar7),
                                  CONCAT14((0 < sVar6) * (sVar6 < 0x100) * auVar21[8] -
                                           (0xff < sVar6),
                                           CONCAT13((0 < sVar5) * (sVar5 < 0x100) * auVar21[6] -
                                                    (0xff < sVar5),
                                                    CONCAT12((0 < sVar4) * (sVar4 < 0x100) *
                                                             auVar21[4] - (0xff < sVar4),
                                                             CONCAT11((0 < sVar3) * (sVar3 < 0x100)
                                                                      * auVar21[2] - (0xff < sVar3),
                                                                      (0 < sVar2) * (sVar2 < 0x100)
                                                                      * auVar21[0] - (0xff < sVar2))
                                                            ))))));
  return;
}

Assistant:

void Stk :: swap64(unsigned char *ptr)
{
  unsigned char val;

  // Swap 1st and 8th bytes
  val = *(ptr);
  *(ptr) = *(ptr+7);
  *(ptr+7) = val;

  // Swap 2nd and 7th bytes
  ptr += 1;
  val = *(ptr);
  *(ptr) = *(ptr+5);
  *(ptr+5) = val;

  // Swap 3rd and 6th bytes
  ptr += 1;
  val = *(ptr);
  *(ptr) = *(ptr+3);
  *(ptr+3) = val;

  // Swap 4th and 5th bytes
  ptr += 1;
  val = *(ptr);
  *(ptr) = *(ptr+1);
  *(ptr+1) = val;
}